

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall aalcalc::fillensemblerec(aalcalc *this,int sidx,double mean,double weighting)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  aal_rec_ensemble *ea;
  int current_ensemble_id;
  double weighting_local;
  double mean_local;
  int sidx_local;
  aalcalc *this_local;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->sidxtoensemble_,(long)sidx);
  iVar1 = *pvVar2;
  pvVar3 = std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>::operator[]
                     (&this->vec_ensemble_aal_,
                      (long)(this->max_ensemble_id_ * (this->current_summary_id_ + -1) + iVar1));
  (pvVar3->super_aal_rec).summary_id = this->current_summary_id_;
  (pvVar3->super_aal_rec).type = 2;
  pvVar3->ensemble_id = iVar1;
  (pvVar3->super_aal_rec).mean = mean * weighting + (pvVar3->super_aal_rec).mean;
  (pvVar3->super_aal_rec).mean_squared =
       mean * mean * weighting + (pvVar3->super_aal_rec).mean_squared;
  return;
}

Assistant:

inline void aalcalc::fillensemblerec(const int sidx, const double mean,
				     const double weighting)
{
	int current_ensemble_id = sidxtoensemble_[sidx];
	aal_rec_ensemble& ea = vec_ensemble_aal_[max_ensemble_id_ * (current_summary_id_ - 1) + current_ensemble_id];
	ea.summary_id = current_summary_id_;
	ea.type = 2;
	ea.ensemble_id = current_ensemble_id;
	ea.mean += mean * weighting;
	ea.mean_squared += mean * mean * weighting;
}